

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall singleParticleSpectra::output_dNdSV(singleParticleSpectra *this)

{
  _Setw _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *pcVar4;
  void *pvVar5;
  string *in_RDI;
  double dNdetas_err;
  int i_3;
  ofstream output3;
  ostringstream filename3;
  int j;
  int i_2;
  ofstream output2_2;
  ofstream output2_1;
  ostringstream filename2_2;
  ostringstream filename2_1;
  double dNdr_err;
  double dNdx2_err;
  double dNdx1_err;
  int i_1;
  ofstream output2;
  ostringstream filename2;
  double dNdtau_err;
  int i;
  ofstream output;
  ostringstream filename;
  double local_1278;
  int local_126c;
  string local_1268 [32];
  undefined1 local_1248 [512];
  ostringstream local_1048 [376];
  int local_ed0;
  int local_ecc;
  int local_ec8;
  int local_ec4;
  int local_ec0;
  int local_ebc;
  string local_eb8 [32];
  undefined1 local_e98 [512];
  string local_c98 [32];
  undefined1 local_c78 [512];
  ostringstream local_a78 [376];
  ostringstream local_900 [376];
  int local_788;
  int local_784;
  double local_780;
  double local_778;
  double local_770;
  int local_764;
  string local_760 [32];
  ostream local_740 [512];
  ostringstream local_540 [376];
  int local_3c8;
  int local_3c4;
  double local_3c0;
  int local_3b4;
  string local_3b0 [32];
  undefined1 local_390 [528];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar3 = std::operator<<((ostream *)local_180,in_RDI);
  poVar3 = std::operator<<(poVar3,"/check_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
  std::operator<<(poVar3,"_dNdtau.dat");
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_390,pcVar4,_S_out);
  std::__cxx11::string::~string(local_3b0);
  for (local_3b4 = 0; local_3b4 < *(int *)(in_RDI + 0x7cc); local_3b4 = local_3b4 + 1) {
    *(double *)(*(long *)(in_RDI + 0x7f0) + (long)local_3b4 * 8) =
         *(double *)(*(long *)(in_RDI + 0x7f0) + (long)local_3b4 * 8) /
         (*(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_3b4 * 8) + 1.0);
    *(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_3b4 * 8) =
         *(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_3b4 * 8) /
         (double)*(int *)(in_RDI + 0x2f8);
    local_3c0 = sqrt(*(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_3b4 * 8) /
                     (double)*(int *)(in_RDI + 0x2f8));
    if (*(int *)(in_RDI + 0x1b8) == 0x14d) {
      *(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_3b4 * 8) =
           *(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_3b4 * 8) /
           *(double *)(in_RDI + 0x1c0);
      local_3c0 = local_3c0 / *(double *)(in_RDI + 0x1c0);
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
    local_3c4 = (int)std::setw(0x12);
    poVar3 = std::operator<<(poVar3,(_Setw)local_3c4);
    local_3c8 = (int)std::setprecision(8);
    poVar3 = std::operator<<(poVar3,(_Setprecision)local_3c8);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x7f0) + (long)local_3b4 * 8));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_3b4 * 8) /
                               *(double *)(in_RDI + 0x7e0));
    poVar3 = std::operator<<(poVar3,"   ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,local_3c0 / *(double *)(in_RDI + 0x7e0));
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream(local_540);
  poVar3 = std::operator<<((ostream *)local_540,in_RDI);
  poVar3 = std::operator<<(poVar3,"/check_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
  std::operator<<(poVar3,"_dNdx.dat");
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_740,pcVar4,_S_out);
  std::__cxx11::string::~string(local_760);
  poVar3 = std::operator<<(local_740,"# x  dN/dx  y  dN/dy  r  dN/dr");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_764 = 0; local_764 < *(int *)(in_RDI + 0x800); local_764 = local_764 + 1) {
    *(double *)(*(long *)(in_RDI + 0x840) + (long)local_764 * 8) =
         *(double *)(*(long *)(in_RDI + 0x840) + (long)local_764 * 8) /
         (*(double *)(*(long *)(in_RDI + 0x848) + (long)local_764 * 8) + 1.0);
    *(double *)(*(long *)(in_RDI + 0x850) + (long)local_764 * 8) =
         *(double *)(*(long *)(in_RDI + 0x850) + (long)local_764 * 8) /
         (*(double *)(*(long *)(in_RDI + 0x858) + (long)local_764 * 8) + 1.0);
    *(double *)(*(long *)(in_RDI + 0x860) + (long)local_764 * 8) =
         *(double *)(*(long *)(in_RDI + 0x860) + (long)local_764 * 8) /
         (*(double *)(*(long *)(in_RDI + 0x868) + (long)local_764 * 8) + 1.0);
    *(double *)(*(long *)(in_RDI + 0x848) + (long)local_764 * 8) =
         *(double *)(*(long *)(in_RDI + 0x848) + (long)local_764 * 8) /
         (double)*(int *)(in_RDI + 0x2f8);
    *(double *)(*(long *)(in_RDI + 0x858) + (long)local_764 * 8) =
         *(double *)(*(long *)(in_RDI + 0x858) + (long)local_764 * 8) /
         (double)*(int *)(in_RDI + 0x2f8);
    *(double *)(*(long *)(in_RDI + 0x868) + (long)local_764 * 8) =
         *(double *)(*(long *)(in_RDI + 0x868) + (long)local_764 * 8) /
         (double)*(int *)(in_RDI + 0x2f8);
    local_770 = sqrt(*(double *)(*(long *)(in_RDI + 0x848) + (long)local_764 * 8) /
                     (double)*(int *)(in_RDI + 0x2f8));
    local_778 = sqrt(*(double *)(*(long *)(in_RDI + 0x858) + (long)local_764 * 8) /
                     (double)*(int *)(in_RDI + 0x2f8));
    local_780 = sqrt(*(double *)(*(long *)(in_RDI + 0x868) + (long)local_764 * 8) /
                     (double)*(int *)(in_RDI + 0x2f8));
    if (*(int *)(in_RDI + 0x1b8) == 0x14d) {
      *(double *)(*(long *)(in_RDI + 0x848) + (long)local_764 * 8) =
           *(double *)(*(long *)(in_RDI + 0x848) + (long)local_764 * 8) /
           *(double *)(in_RDI + 0x1c0);
      *(double *)(*(long *)(in_RDI + 0x858) + (long)local_764 * 8) =
           *(double *)(*(long *)(in_RDI + 0x858) + (long)local_764 * 8) /
           *(double *)(in_RDI + 0x1c0);
      *(double *)(*(long *)(in_RDI + 0x868) + (long)local_764 * 8) =
           *(double *)(*(long *)(in_RDI + 0x868) + (long)local_764 * 8) /
           *(double *)(in_RDI + 0x1c0);
      local_770 = local_770 / *(double *)(in_RDI + 0x1c0);
      local_778 = local_778 / *(double *)(in_RDI + 0x1c0);
      local_780 = local_780 / *(double *)(in_RDI + 0x1c0);
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_740,std::scientific);
    local_784 = (int)std::setw(0x12);
    poVar3 = std::operator<<(poVar3,(_Setw)local_784);
    local_788 = (int)std::setprecision(8);
    poVar3 = std::operator<<(poVar3,(_Setprecision)local_788);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x840) + (long)local_764 * 8));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x848) + (long)local_764 * 8) /
                               *(double *)(in_RDI + 0x818));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_770 / *(double *)(in_RDI + 0x818));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x850) + (long)local_764 * 8));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x858) + (long)local_764 * 8) /
                               *(double *)(in_RDI + 0x818));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_778 / *(double *)(in_RDI + 0x818));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x860) + (long)local_764 * 8));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x868) + (long)local_764 * 8) /
                               *(double *)(in_RDI + 0x838));
    poVar3 = std::operator<<(poVar3,"   ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,local_780 / *(double *)(in_RDI + 0x838));
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream(local_900);
  std::__cxx11::ostringstream::ostringstream(local_a78);
  poVar3 = std::operator<<((ostream *)local_900,in_RDI);
  poVar3 = std::operator<<(poVar3,"/check_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
  std::operator<<(poVar3,"_dNdtaudx1.dat");
  poVar3 = std::operator<<((ostream *)local_a78,in_RDI);
  poVar3 = std::operator<<(poVar3,"/check_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
  std::operator<<(poVar3,"_dNdtaudx2.dat");
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_c78,pcVar4,_S_out);
  std::__cxx11::string::~string(local_c98);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_e98,pcVar4,_S_out);
  std::__cxx11::string::~string(local_eb8);
  for (local_ebc = 0; local_ebc < *(int *)(in_RDI + 0x7cc); local_ebc = local_ebc + 1) {
    for (local_ec0 = 0; local_ec0 < *(int *)(in_RDI + 0x800); local_ec0 = local_ec0 + 1) {
      *(double *)(*(long *)(*(long *)(in_RDI + 0x870) + (long)local_ebc * 8) + (long)local_ec0 * 8)
           = *(double *)
              (*(long *)(*(long *)(in_RDI + 0x870) + (long)local_ebc * 8) + (long)local_ec0 * 8) /
             (double)*(int *)(in_RDI + 0x2f8);
      *(double *)(*(long *)(*(long *)(in_RDI + 0x878) + (long)local_ebc * 8) + (long)local_ec0 * 8)
           = *(double *)
              (*(long *)(*(long *)(in_RDI + 0x878) + (long)local_ebc * 8) + (long)local_ec0 * 8) /
             (double)*(int *)(in_RDI + 0x2f8);
      if (*(int *)(in_RDI + 0x1b8) == 0x14d) {
        *(double *)
         (*(long *)(*(long *)(in_RDI + 0x870) + (long)local_ebc * 8) + (long)local_ec0 * 8) =
             *(double *)
              (*(long *)(*(long *)(in_RDI + 0x870) + (long)local_ebc * 8) + (long)local_ec0 * 8) /
             *(double *)(in_RDI + 0x1c0);
        *(double *)
         (*(long *)(*(long *)(in_RDI + 0x878) + (long)local_ebc * 8) + (long)local_ec0 * 8) =
             *(double *)
              (*(long *)(*(long *)(in_RDI + 0x878) + (long)local_ebc * 8) + (long)local_ec0 * 8) /
             *(double *)(in_RDI + 0x1c0);
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_c78,std::scientific);
      local_ec4 = (int)std::setw(0x12);
      poVar3 = std::operator<<(poVar3,(_Setw)local_ec4);
      local_ec8 = (int)std::setprecision(8);
      poVar3 = std::operator<<(poVar3,(_Setprecision)local_ec8);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(*(double *)
                                   (*(long *)(*(long *)(in_RDI + 0x870) + (long)local_ebc * 8) +
                                   (long)local_ec0 * 8) / *(double *)(in_RDI + 0x818)) /
                                 *(double *)(in_RDI + 0x7e0));
      std::operator<<(poVar3,"   ");
      poVar3 = (ostream *)std::ostream::operator<<(local_e98,std::scientific);
      local_ecc = (int)std::setw(0x12);
      poVar3 = std::operator<<(poVar3,(_Setw)local_ecc);
      local_ed0 = (int)std::setprecision(8);
      poVar3 = std::operator<<(poVar3,(_Setprecision)local_ed0);
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(*(double *)
                                   (*(long *)(*(long *)(in_RDI + 0x878) + (long)local_ebc * 8) +
                                   (long)local_ec0 * 8) / *(double *)(in_RDI + 0x818)) /
                                 *(double *)(in_RDI + 0x7e0));
      std::operator<<(poVar3,"   ");
    }
    std::ostream::operator<<(local_c78,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(local_e98,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream(local_1048);
  poVar3 = std::operator<<((ostream *)local_1048,in_RDI);
  poVar3 = std::operator<<(poVar3,"/check_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
  std::operator<<(poVar3,"_dNdetas.dat");
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_1248,pcVar4,_S_out);
  std::__cxx11::string::~string(local_1268);
  for (local_126c = 0; local_126c < *(int *)(in_RDI + 0x880); local_126c = local_126c + 1) {
    *(double *)(*(long *)(in_RDI + 0x8a8) + (long)local_126c * 8) =
         *(double *)(*(long *)(in_RDI + 0x8a8) + (long)local_126c * 8) /
         (*(double *)(*(long *)(in_RDI + 0x8b0) + (long)local_126c * 8) + 1.0);
    *(double *)(*(long *)(in_RDI + 0x8b0) + (long)local_126c * 8) =
         *(double *)(*(long *)(in_RDI + 0x8b0) + (long)local_126c * 8) /
         (double)*(int *)(in_RDI + 0x2f8);
    local_1278 = sqrt(*(double *)(*(long *)(in_RDI + 0x8b0) + (long)local_126c * 8) /
                      (double)*(int *)(in_RDI + 0x2f8));
    if (*(int *)(in_RDI + 0x1b8) == 0x14d) {
      *(double *)(*(long *)(in_RDI + 0x8b0) + (long)local_126c * 8) =
           *(double *)(*(long *)(in_RDI + 0x8b0) + (long)local_126c * 8) /
           *(double *)(in_RDI + 0x1c0);
      local_1278 = local_1278 / *(double *)(in_RDI + 0x1c0);
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_1248,std::scientific);
    _Var1 = std::setw(0x12);
    poVar3 = std::operator<<(poVar3,_Var1);
    _Var2 = std::setprecision(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x8a8) + (long)local_126c * 8));
    poVar3 = std::operator<<(poVar3,"   ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(double *)(*(long *)(in_RDI + 0x8b0) + (long)local_126c * 8) /
                               *(double *)(in_RDI + 0x898));
    poVar3 = std::operator<<(poVar3,"   ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,local_1278 / *(double *)(in_RDI + 0x898));
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_1248);
  std::__cxx11::ostringstream::~ostringstream(local_1048);
  std::ofstream::~ofstream(local_e98);
  std::ofstream::~ofstream(local_c78);
  std::__cxx11::ostringstream::~ostringstream(local_a78);
  std::__cxx11::ostringstream::~ostringstream(local_900);
  std::ofstream::~ofstream(local_740);
  std::__cxx11::ostringstream::~ostringstream(local_540);
  std::ofstream::~ofstream(local_390);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void singleParticleSpectra::output_dNdSV() {
    // first dN/dtau
    ostringstream filename;
    filename << path_ << "/check_" << particle_monval << "_dNdtau.dat";
    ofstream output(filename.str().c_str());
    for (int i = 0; i < N_tau; i++) {
        tau_array[i] = tau_array[i] / (dNdtau_array[i] + 1.);
        dNdtau_array[i] = dNdtau_array[i] / total_number_of_events;
        double dNdtau_err = sqrt(dNdtau_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdtau_array[i] = dNdtau_array[i] / reconst_branching_ratio;
            dNdtau_err = dNdtau_err / reconst_branching_ratio;
        }
        output << scientific << setw(18) << setprecision(8) << tau_array[i]
               << "   " << dNdtau_array[i] / dtau << "   " << dNdtau_err / dtau
               << endl;
    }
    output.close();

    // second dN/dx
    ostringstream filename2;
    filename2 << path_ << "/check_" << particle_monval << "_dNdx.dat";
    ofstream output2(filename2.str().c_str());
    output2 << "# x  dN/dx  y  dN/dy  r  dN/dr" << endl;
    for (int i = 0; i < N_xpt; i++) {
        xpt_array[i] = xpt_array[i] / (dNdx1_array[i] + 1.);
        ypt_array[i] = ypt_array[i] / (dNdx2_array[i] + 1.);
        rpt_array[i] = rpt_array[i] / (dNdr_array[i] + 1.);
        dNdx1_array[i] = dNdx1_array[i] / total_number_of_events;
        dNdx2_array[i] = dNdx2_array[i] / total_number_of_events;
        dNdr_array[i] = dNdr_array[i] / total_number_of_events;
        double dNdx1_err = sqrt(dNdx1_array[i] / total_number_of_events);
        double dNdx2_err = sqrt(dNdx2_array[i] / total_number_of_events);
        double dNdr_err = sqrt(dNdr_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdx1_array[i] = dNdx1_array[i] / reconst_branching_ratio;
            dNdx2_array[i] = dNdx2_array[i] / reconst_branching_ratio;
            dNdr_array[i] = dNdr_array[i] / reconst_branching_ratio;
            dNdx1_err = dNdx1_err / reconst_branching_ratio;
            dNdx2_err = dNdx2_err / reconst_branching_ratio;
            dNdr_err = dNdr_err / reconst_branching_ratio;
        }
        output2 << scientific << setw(18) << setprecision(8) << xpt_array[i]
                << "   " << dNdx1_array[i] / dspatial_x << "   "
                << dNdx1_err / dspatial_x << "   " << ypt_array[i] << "   "
                << dNdx2_array[i] / dspatial_x << "   "
                << dNdx2_err / dspatial_x << "   " << rpt_array[i] << "   "
                << dNdr_array[i] / dspatial_r << "   " << dNdr_err / dspatial_r
                << endl;
    }
    output2.close();

    // dN/(dtau dx)
    ostringstream filename2_1, filename2_2;
    filename2_1 << path_ << "/check_" << particle_monval << "_dNdtaudx1.dat";
    filename2_2 << path_ << "/check_" << particle_monval << "_dNdtaudx2.dat";
    ofstream output2_1(filename2_1.str().c_str());
    ofstream output2_2(filename2_2.str().c_str());
    for (int i = 0; i < N_tau; i++) {
        for (int j = 0; j < N_xpt; j++) {
            dNdtaudx1_array[i][j] =
                (dNdtaudx1_array[i][j] / total_number_of_events);
            dNdtaudx2_array[i][j] =
                (dNdtaudx2_array[i][j] / total_number_of_events);
            if (particle_monval == 333) {
                dNdtaudx1_array[i][j] =
                    (dNdtaudx1_array[i][j] / reconst_branching_ratio);
                dNdtaudx2_array[i][j] =
                    (dNdtaudx2_array[i][j] / reconst_branching_ratio);
            }
            output2_1 << scientific << setw(18) << setprecision(8)
                      << dNdtaudx1_array[i][j] / dspatial_x / dtau << "   ";
            output2_2 << scientific << setw(18) << setprecision(8)
                      << dNdtaudx2_array[i][j] / dspatial_x / dtau << "   ";
        }
        output2_1 << endl;
        output2_2 << endl;
    }
    output2_1.close();
    output2_2.close();

    // third dN/detas
    ostringstream filename3;
    filename3 << path_ << "/check_" << particle_monval << "_dNdetas.dat";
    ofstream output3(filename3.str().c_str());
    for (int i = 0; i < N_eta_s; i++) {
        eta_s_array[i] = eta_s_array[i] / (dNdetas_array[i] + 1.);
        dNdetas_array[i] = dNdetas_array[i] / total_number_of_events;
        double dNdetas_err = sqrt(dNdetas_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdetas_array[i] = dNdetas_array[i] / reconst_branching_ratio;
            dNdetas_err = dNdetas_err / reconst_branching_ratio;
        }
        output3 << scientific << setw(18) << setprecision(8) << eta_s_array[i]
                << "   " << dNdetas_array[i] / deta_s << "   "
                << dNdetas_err / deta_s << endl;
    }
    output3.close();
}